

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O1

shared_ptr<helics::Core> helics::CoreFactory::getEmptyCore(void)

{
  _func_int **pp_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  shared_ptr<helics::Core> sVar2;
  shared_ptr<helics::Core> sVar3;
  
  in_RDI->_vptr_Core = emptyCore;
  pp_Var1 = DAT_00556790;
  in_RDI[1]._vptr_Core = DAT_00556790;
  if (pp_Var1 != (_func_int **)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      *(int *)(pp_Var1 + 1) = *(int *)(pp_Var1 + 1) + 1;
      sVar2.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar2.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (shared_ptr<helics::Core>)
             sVar2.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    *(int *)(pp_Var1 + 1) = *(int *)(pp_Var1 + 1) + 1;
    UNLOCK();
  }
  sVar3.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar3.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<helics::Core>)
         sVar3.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Core> getEmptyCore()
{
    return emptyCore;
}